

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  TextureFormat TVar1;
  CoordType CVar2;
  int iVar3;
  CoordType CVar4;
  RenderContext *context;
  TestLog *pTVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar12;
  uint uVar13;
  int iVar14;
  byte bVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  int iVar19;
  PixelFormat *pPVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int local_480;
  RandomViewport viewport;
  float *local_450;
  undefined1 local_440 [40];
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  undefined1 local_3e8 [40];
  undefined1 local_3c0 [40];
  Surface referenceFrame;
  undefined1 local_380 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_330;
  ulong local_320;
  PixelFormat *local_318;
  Texture2D *local_310;
  LookupPrecision local_308;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [6];
  undefined1 local_244 [76];
  _func_int **pp_Stack_1f8;
  size_type local_1f0;
  int aiStack_1e8 [2];
  int local_1e0;
  LodMode local_1c4;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  undefined1 auStack_18c [84];
  ios_base local_138 [264];
  
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar7);
  local_310 = this->m_texture;
  iVar14 = (local_310->m_refTexture).m_width << 2;
  iVar12 = (local_310->m_refTexture).m_height << 2;
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar8 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar7),iVar14,iVar12,dVar8);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_244,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar2 = this->m_coordType;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  iVar7 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar7 = viewport.width;
  }
  iVar3 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar3 = viewport.height;
  }
  if ((viewport.width < iVar14 >> 1) || (viewport.height < iVar12 >> 1)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
               ,0x116);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1b0,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  local_1e0 = local_190;
  local_1f0 = local_1a0._M_allocated_capacity;
  aiStack_1e8[0] = local_1a0._8_4_;
  aiStack_1e8[1] = local_1a0._12_4_;
  local_244._68_8_ = local_1b0;
  pp_Stack_1f8 = pp_Stack_1a8;
  local_244._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_244._8_4_ = (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2
  ;
  local_1c4 = LODMODE_EXACT;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar16 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar16 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar16 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar16 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar16 + 0x1360))(0xde1,0x2800,0x2600);
  dVar8 = (**(code **)(lVar16 + 0x800))();
  glu::checkError(dVar8,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x128);
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  iVar7 = iVar7 >> 2;
  iVar3 = iVar3 >> 2;
  uVar13 = 0;
  lVar10 = 0;
  do {
    iVar12 = iVar3 * (int)lVar10;
    iVar14 = 0;
    iVar19 = 0;
    uVar22 = uVar13;
    for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 0x10) {
      iVar9 = viewport.width + iVar19;
      if (lVar18 != 0x30) {
        iVar9 = iVar7;
      }
      iVar6 = viewport.height - iVar12;
      if (lVar10 != 3) {
        iVar6 = iVar3;
      }
      CVar4 = this->m_coordType;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_00f3ad64:
        getBasicTexCoord2D(&texCoord,uVar22);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,uVar22);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_00f3ad64;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_244._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar18);
        local_244._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar18 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_244._28_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar22 & 7];
      }
      (**(code **)(lVar16 + 0x1a00))(viewport.x + iVar14,viewport.y + iVar12,iVar9,iVar6);
      uVar22 = uVar22 + 1;
      iVar19 = iVar19 - iVar7;
      iVar14 = iVar14 + iVar7;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_244);
    }
    lVar10 = lVar10 + 1;
    uVar13 = uVar13 + 4;
  } while (lVar10 != 4);
  context = this->m_renderCtx;
  res.m_data[0] = 8;
  res.m_data[1] = 3;
  pvVar17 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar17 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&res,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar17);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
  iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar16 = CONCAT44(extraout_var_01,iVar12);
  uVar13 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  pPVar20 = (PixelFormat *)(lVar16 + 8);
  uVar13 = ~(uint)((uVar13 & 0xfffffffe) == 0x2702);
  local_308.colorThreshold.m_data[0] = 0.0;
  local_308.colorThreshold.m_data[1] = 0.0;
  local_308.colorThreshold.m_data[2] = 0.0;
  local_308.colorThreshold.m_data[3] = 0.0;
  local_308.colorMask.m_data[0] = true;
  local_308.colorMask.m_data[1] = true;
  local_308.colorMask.m_data[2] = true;
  local_308.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_308.coordBits.m_data[0] = 0x14;
  local_308.coordBits.m_data[1] = 0x14;
  local_308.coordBits.m_data[2] = 0;
  local_308.uvwBits.m_data[0] = 0x10;
  local_308.uvwBits.m_data[1] = 0x10;
  local_308.uvwBits.m_data[2] = 0;
  uVar22 = uVar13 + pPVar20->redBits;
  uVar23 = uVar13 + *(int *)(lVar16 + 0xc);
  uVar24 = uVar13 + *(int *)(lVar16 + 0x10);
  uVar13 = uVar13 + *(int *)(lVar16 + 0x14);
  res.m_data[1] = -(uint)(0 < (int)uVar23) & uVar23;
  res.m_data[0] = -(uint)(0 < (int)uVar22) & uVar22;
  res.m_data[3] = -(uint)(0 < (int)uVar13) & uVar13;
  res.m_data[2] = -(uint)(0 < (int)uVar24) & uVar24;
  tcu::computeFixedPointThreshold((tcu *)local_1b0,&res);
  auVar21._0_4_ = -(uint)(0 < pPVar20->redBits);
  auVar21._4_4_ = -(uint)(0 < *(int *)(lVar16 + 0xc));
  auVar21._8_4_ = -(uint)(0 < *(int *)(lVar16 + 0x10));
  auVar21._12_4_ = -(uint)(0 < *(int *)(lVar16 + 0x14));
  uVar13 = movmskps((int)local_1b0,auVar21);
  bVar15 = (byte)uVar13;
  local_308.colorMask.m_data =
       (bool  [4])
       (uVar13 & 1 | (uint)((bVar15 & 2) >> 1) << 8 | (uint)((bVar15 & 4) >> 2) << 0x10 |
       (uint)(bVar15 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  uVar13 = 0;
  lVar16 = 0;
  local_480 = 0;
  local_318 = pPVar20;
  do {
    local_320 = (ulong)uVar13;
    local_450 = Accuracy::Texture2DMipmapCase::iterate::s_bias + (uVar13 & 7);
    iVar12 = iVar3 * (int)lVar16;
    lVar10 = 0;
    iVar19 = 0;
    iVar14 = 0;
    do {
      iVar9 = viewport.width + iVar14;
      if (lVar10 != 0x30) {
        iVar9 = iVar7;
      }
      iVar6 = viewport.height - iVar12;
      if (lVar16 != 3) {
        iVar6 = iVar3;
      }
      CVar4 = this->m_coordType;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_00f3b0bc:
        getBasicTexCoord2D(&texCoord,uVar13);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,uVar13);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_00f3b0bc;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_244._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar10);
        local_244._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar10 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_244._28_4_ = *local_450;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1b0,&referenceFrame,local_318,iVar19,iVar12,iVar9,iVar6);
      res.m_data._8_8_ = (local_310->m_refTexture).m_view.m_levels;
      res.m_data[0] = (local_310->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1b0,(Texture2DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_244);
      local_440._0_4_ = RGBA;
      local_440._4_4_ = UNORM_INT8;
      pvVar17 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar17 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_440,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)local_1b0,(PixelBufferAccess *)&res,iVar19,iVar12,iVar9
                        ,iVar6);
      local_3e8._0_4_ = RGBA;
      local_3e8._4_4_ = UNORM_INT8;
      pvVar17 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar17 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3c0,(TextureFormat *)local_3e8,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)local_440,(PixelBufferAccess *)local_3c0,iVar19,iVar12,
                        iVar9,iVar6);
      local_330.m_numLevels = 8;
      local_330._4_4_ = 3;
      pvVar17 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar17 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_380,(TextureFormat *)&local_330,errorMask.m_width,
                 errorMask.m_height,1,pvVar17);
      tcu::getSubregion((PixelBufferAccess *)local_3e8,(PixelBufferAccess *)local_380,iVar19,iVar12,
                        iVar9,iVar6);
      local_330.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_330.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar9 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)local_440,
                         (PixelBufferAccess *)local_3e8,&local_330,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_244,&local_308,
                         &lodPrec,((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
      local_480 = local_480 + iVar9;
      iVar14 = iVar14 - iVar7;
      iVar19 = iVar19 + iVar7;
      lVar10 = lVar10 + 0x10;
      uVar13 = uVar13 + 1;
      local_450 = local_450 + 1;
    } while (lVar10 != 0x40);
    lVar16 = lVar16 + 1;
    uVar13 = (int)local_320 + 4;
    if (lVar16 == 4) {
      if (0 < local_480) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1a8,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,local_480);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1a8," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
        std::ios_base::~ios_base(local_138);
      }
      pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_440._0_8_ = (long)local_440 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Result","");
      local_3c0._0_8_ = (long)local_3c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_440,(string *)local_3c0);
      tcu::TestLog::startImageSet(pTVar5,(char *)res.m_data._0_8_,local_2b8._M_p);
      local_3e8._0_8_ = (long)local_3e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Rendered","");
      TVar1 = (TextureFormat)((long)local_380 + 0x10);
      local_380._0_8_ = TVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Rendered image","");
      pSVar11 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,(string *)local_3e8,(string *)local_380,pSVar11,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar5,__buf,(size_t)pSVar11);
      if ((undefined1 *)CONCAT44(auStack_18c._0_4_,local_190) != auStack_18c + 0xc) {
        operator_delete((undefined1 *)CONCAT44(auStack_18c._0_4_,local_190),
                        CONCAT44(auStack_18c._16_4_,auStack_18c._12_4_) + 1);
      }
      if (local_1b0 != (undefined1  [8])&local_1a0) {
        operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
      }
      if ((TextureFormat)local_380._0_8_ != TVar1) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_3e8._0_8_ != (long)local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_p != local_2a8) {
        operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_2c8) {
        operator_delete((void *)res.m_data._0_8_,local_2c8._M_allocated_capacity + 1);
      }
      if (local_3c0._0_8_ != (long)local_3c0 + 0x10) {
        operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
      }
      if (local_440._0_8_ != (long)local_440 + 0x10) {
        operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      }
      if (0 < local_480) {
        pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        local_440._0_8_ = (long)local_440 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"Reference","");
        local_3c0._0_8_ = (long)local_3c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Ideal reference","");
        pSVar11 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,(string *)local_440,(string *)local_3c0,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar7 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_1b0,iVar7,__buf_00,(size_t)pSVar11);
        local_3e8._0_8_ = (long)local_3e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"ErrorMask","");
        local_380._0_8_ = TVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Error mask","");
        pSVar11 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)local_3e8,(string *)local_380,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res,iVar7,__buf_01,(size_t)pSVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_p != local_2a8) {
          operator_delete(local_2b8._M_p,local_2a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.m_data._0_8_ != &local_2c8) {
          operator_delete((void *)res.m_data._0_8_,local_2c8._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_380._0_8_ != TVar1) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        }
        if (local_3e8._0_8_ != (long)local_3e8 + 0x10) {
          operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
        }
        if ((undefined1 *)CONCAT44(auStack_18c._0_4_,local_190) != auStack_18c + 0xc) {
          operator_delete((undefined1 *)CONCAT44(auStack_18c._0_4_,local_190),
                          CONCAT44(auStack_18c._16_4_,auStack_18c._12_4_) + 1);
        }
        if (local_1b0 != (undefined1  [8])&local_1a0) {
          operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
        }
        if (local_3c0._0_8_ != (long)local_3c0 + 0x10) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ + 1);
        }
        if (local_440._0_8_ != (long)local_440 + 0x10) {
          operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
        }
      }
      tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
      description = "Pass";
      if (local_480 != 0) {
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(local_480 != 0),description)
      ;
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();

	const deUint32				magFilter			= GL_NEAREST;
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();
	const int					defViewportWidth	= texWidth*4;
	const int					defViewportHeight	= texHeight*4;

	const RandomViewport		viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	sampleParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}